

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv_test.cc
# Opt level: O3

void kv_get_var_nentry_test(void)

{
  uint64_t uVar1;
  void *pvVar2;
  bool bVar3;
  ushort uVar4;
  uint uVar5;
  int iVar6;
  size_t sVar7;
  ushort *puVar8;
  bnode *pbVar9;
  btree_kv_ops *pbVar10;
  size_t i;
  char *pcVar11;
  long lVar12;
  __suseconds_t *p_Var13;
  bool bVar14;
  undefined8 *puVar15;
  ulong uVar16;
  undefined2 *__ptr;
  char cVar17;
  timeval *ptVar18;
  long lStack_308;
  long lStack_300;
  timeval tStack_2f8;
  btree bStack_2e8;
  btree_kv_ops *pbStack_2b0;
  undefined8 *puStack_2a8;
  undefined2 *puStack_2a0;
  code *pcStack_298;
  undefined2 *puStack_290;
  undefined2 *puStack_288;
  timeval tStack_280;
  bnode *pbStack_270;
  uint64_t uStack_268;
  code *pcStack_260;
  btree_kv_ops bStack_258;
  undefined8 uStack_1e0;
  timeval tStack_1d8;
  undefined8 uStack_1c8;
  undefined8 uStack_1c0;
  char cStack_1b1;
  bnode *pbStack_1b0;
  undefined2 **ppuStack_1a8;
  long *plStack_1a0;
  char *pcStack_198;
  btree_kv_ops *pbStack_190;
  void **ppvStack_188;
  long lStack_178;
  long lStack_170;
  void *pvStack_168;
  undefined2 *puStack_160;
  timeval tStack_158;
  bnode *pbStack_148;
  void *pvStack_140;
  undefined8 *puStack_138;
  btree_kv_ops *pbStack_130;
  long lStack_128;
  code *pcStack_120;
  btree_kv_ops local_118;
  undefined8 uStack_a0;
  undefined1 local_98 [8];
  timeval __test_begin;
  void *vars [2];
  void *local_40;
  void *k_out;
  uint8_t v_out;
  uint8_t v;
  undefined7 uVar19;
  
  lVar12 = 0;
  uStack_a0 = 0x10358d;
  gettimeofday((timeval *)local_98,(__timezone_ptr_t)0x0);
  uStack_a0 = 0x103592;
  memleak_start();
  local_40 = (void *)0x0;
  puVar15 = &DAT_00109d70;
  do {
    pcVar11 = *(char **)((long)&DAT_00109d70 + lVar12);
    uStack_a0 = 0x1035ad;
    sVar7 = strlen(pcVar11);
    uVar5 = (int)sVar7 + 1;
    uVar16 = (ulong)(uVar5 & 0xffff);
    uStack_a0 = 0x1035bc;
    puVar8 = (ushort *)malloc(uVar16 + 2);
    uVar4 = (ushort)uVar5;
    *puVar8 = uVar4 << 8 | uVar4 >> 8;
    uStack_a0 = 0x1035d9;
    memcpy(puVar8 + 1,pcVar11,uVar16);
    *(ushort **)((long)&__test_begin.tv_usec + lVar12) = puVar8;
    lVar12 = lVar12 + 8;
  } while (lVar12 != 0x30);
  uStack_a0 = 0x1035f2;
  pbVar9 = (bnode *)malloc(0x1010);
  pbVar9->kvsize = 0x901;
  pbVar9->flag = 0;
  pbVar9->level = 1;
  pbVar9->nentry = 6;
  (pbVar9->field_4).data = pbVar9 + 1;
  k_out._7_1_ = 'd';
  pcStack_120 = (code *)0x103623;
  btree_str_kv_get_kb64_vb64(&local_118);
  p_Var13 = &__test_begin.tv_usec;
  lVar12 = 0;
  do {
    pcStack_120 = (code *)0x10363c;
    (*local_118.set_kv)(pbVar9,(idx_t)lVar12,p_Var13,(void *)((long)&k_out + 7));
    k_out._7_1_ = k_out._7_1_ + '\x01';
    lVar12 = lVar12 + 1;
    p_Var13 = p_Var13 + 1;
  } while (lVar12 != 6);
  k_out._7_1_ = 'd';
  lVar12 = 0;
  while( true ) {
    pcStack_120 = (code *)0x103665;
    (*local_118.get_kv)(pbVar9,(idx_t)lVar12,&local_40,(void *)((long)&k_out + 6));
    pvVar2 = local_40;
    pcStack_120 = (code *)0x103677;
    iVar6 = strcmp((char *)((long)local_40 + 2),(char *)*puVar15);
    if (iVar6 != 0) break;
    if (k_out._6_1_ != k_out._7_1_) {
      pcStack_120 = (code *)0x103719;
      kv_get_var_nentry_test();
      break;
    }
    k_out._7_1_ = k_out._6_1_ + '\x01';
    lVar12 = lVar12 + 1;
    puVar15 = puVar15 + 1;
    if (lVar12 == 6) {
      vars[0] = pvVar2;
      lVar12 = 0;
      do {
        pcStack_120 = (code *)0x1036b1;
        free(vars[lVar12 + -1]);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 2);
      lVar12 = 0;
      do {
        pcStack_120 = (code *)0x1036c6;
        free((void *)(&__test_begin.tv_usec)[lVar12]);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 6);
      pcStack_120 = (code *)0x1036d4;
      memleak_end();
      pcVar11 = "%s PASSED\n";
      if (kv_get_var_nentry_test()::__test_pass != '\0') {
        pcVar11 = "%s FAILED\n";
      }
      pcStack_120 = (code *)0x103705;
      fprintf(_stderr,pcVar11,"kv_get_var_nentry_test");
      return;
    }
  }
  pcStack_120 = kv_ins_var;
  kv_get_var_nentry_test();
  pvStack_140 = pvVar2;
  ppvStack_188 = (void **)0x103738;
  pbStack_148 = pbVar9;
  puStack_138 = puVar15;
  pbStack_130 = &local_118;
  lStack_128 = lVar12;
  pcStack_120 = (code *)&stack0xfffffffffffffff8;
  gettimeofday(&tStack_158,(__timezone_ptr_t)0x0);
  ppvStack_188 = (void **)0x10373d;
  memleak_start();
  ppvStack_188 = (void **)0x103747;
  puStack_160 = (undefined2 *)malloc(0xd);
  *puStack_160 = 0xb00;
  *(undefined8 *)(puStack_160 + 1) = 0x6972747374736574;
  *(undefined4 *)((long)puStack_160 + 9) = 0x676e69;
  ppvStack_188 = (void **)0x10377b;
  pbVar9 = (bnode *)malloc(0x1010);
  pbVar9->kvsize = 0xd08;
  pbVar9->flag = 0;
  pbVar9->level = 1;
  pbVar9->nentry = 0;
  (pbVar9->field_4).data = pbVar9 + 1;
  lStack_170 = 0x14;
  pvStack_168 = (void *)0x0;
  ppvStack_188 = (void **)0x1037b4;
  pbVar10 = btree_str_kv_get_kb64_vb64((btree_kv_ops *)0x0);
  ppvStack_188 = (void **)0x1037c5;
  (*pbVar10->ins_kv)(pbVar9,0,&puStack_160,&lStack_170);
  ppvStack_188 = (void **)0x1037d5;
  (*pbVar10->get_kv)(pbVar9,0,&pvStack_168,&lStack_178);
  ppvStack_188 = (void **)0x1037e5;
  iVar6 = strcmp((char *)((long)pvStack_168 + 2),"teststring");
  if (iVar6 == 0) {
    if (lStack_178 == lStack_170) {
      ppvStack_188 = (void **)0x1037fd;
      free(pbVar9);
      ppvStack_188 = (void **)0x103805;
      free(pbVar10);
      ppvStack_188 = (void **)0x10380f;
      free(puStack_160);
      ppvStack_188 = (void **)0x103819;
      free(pvStack_168);
      ppvStack_188 = (void **)0x10381e;
      memleak_end();
      pcVar11 = "%s PASSED\n";
      if (kv_ins_var()::__test_pass != '\0') {
        pcVar11 = "%s FAILED\n";
      }
      ppvStack_188 = (void **)0x10384f;
      fprintf(_stderr,pcVar11,"kv_ins_var");
      return;
    }
  }
  else {
    ppvStack_188 = (void **)0x103863;
    kv_ins_var();
  }
  ppvStack_188 = (void **)kv_ins_var_nentry_test;
  kv_ins_var();
  pcStack_198 = "teststring";
  ptVar18 = &tStack_1d8;
  lVar12 = 0;
  uStack_1e0 = 0x103886;
  pbStack_1b0 = pbVar9;
  ppuStack_1a8 = &puStack_160;
  plStack_1a0 = &lStack_170;
  pbStack_190 = pbVar10;
  ppvStack_188 = &pvStack_168;
  gettimeofday(&tStack_1d8,(__timezone_ptr_t)0x0);
  uStack_1e0 = 0x10388b;
  memleak_start();
  puVar15 = &uStack_1c8;
  bVar3 = true;
  do {
    bVar14 = bVar3;
    pcVar11 = (char *)(&DAT_00109d60)[lVar12];
    uStack_1e0 = 0x1038a5;
    sVar7 = strlen(pcVar11);
    uVar5 = (int)sVar7 + 1;
    uVar16 = (ulong)(uVar5 & 0xffff);
    uStack_1e0 = 0x1038b4;
    puVar8 = (ushort *)malloc(uVar16 + 2);
    uVar4 = (ushort)uVar5;
    *puVar8 = uVar4 << 8 | uVar4 >> 8;
    uStack_1e0 = 0x1038d1;
    memcpy(puVar8 + 1,pcVar11,uVar16);
    *puVar15 = puVar8;
    lVar12 = 1;
    puVar15 = &uStack_1c0;
    bVar3 = false;
  } while (bVar14);
  uStack_1e0 = 0x1038f4;
  pbVar9 = (bnode *)malloc(0x1010);
  pbVar9->kvsize = 0x901;
  pbVar9->flag = 0;
  pbVar9->level = 1;
  pbVar9->nentry = 2;
  (pbVar9->field_4).data = pbVar9 + 1;
  cStack_1b1 = 'd';
  pcStack_260 = (code *)0x103923;
  btree_str_kv_get_kb64_vb64(&bStack_258);
  pcStack_260 = (code *)0x103933;
  (*bStack_258.ins_kv)(pbVar9,0,&uStack_1c8,&cStack_1b1);
  cStack_1b1 = cStack_1b1 + '\x01';
  pcStack_260 = (code *)0x103946;
  (*bStack_258.ins_kv)(pbVar9,0,&uStack_1c0,&cStack_1b1);
  uVar1 = (pbVar9->field_4).dummy;
  pcStack_260 = (code *)0x10395a;
  iVar6 = strcmp((char *)(uVar1 + 2),"longstring");
  if (iVar6 == 0) {
    cVar17 = *(char *)(uVar1 + 0xd);
    uVar19 = (undefined7)((ulong)&tStack_1d8 >> 8);
    ptVar18 = (timeval *)CONCAT71(uVar19,cVar17);
    if (cVar17 != cStack_1b1) goto LAB_001039b1;
    cVar17 = cVar17 + -1;
    ptVar18 = (timeval *)CONCAT71(uVar19,cVar17);
    pcStack_260 = (code *)0x10397f;
    cStack_1b1 = cVar17;
    iVar6 = strcmp((char *)(uVar1 + 0x10),"string");
    if (iVar6 == 0) {
      if (*(char *)(uVar1 + 0x17) == cVar17) {
        pcStack_260 = (code *)0x10399d;
        kv_ins_var_nentry_test();
        return;
      }
      goto LAB_001039bb;
    }
  }
  else {
    pcStack_260 = (code *)0x1039b1;
    kv_ins_var_nentry_test();
LAB_001039b1:
    pcStack_260 = (code *)0x1039b6;
    kv_ins_var_nentry_test();
  }
  pcStack_260 = (code *)0x1039bb;
  kv_ins_var_nentry_test();
LAB_001039bb:
  pcStack_260 = kv_set_str_key_test;
  kv_ins_var_nentry_test();
  pcStack_298 = (code *)0x1039d5;
  pbStack_270 = pbVar9;
  uStack_268 = uVar1;
  pcStack_260 = (code *)ptVar18;
  gettimeofday(&tStack_280,(__timezone_ptr_t)0x0);
  pcStack_298 = (code *)0x1039da;
  memleak_start();
  puStack_290 = (undefined2 *)0x0;
  pcStack_298 = (code *)0x1039eb;
  pbVar10 = btree_str_kv_get_kb64_vb64((btree_kv_ops *)0x0);
  pcStack_298 = (code *)0x1039f8;
  puStack_288 = (undefined2 *)malloc(0xd);
  *puStack_288 = 0xb00;
  *(undefined8 *)(puStack_288 + 1) = 0x6972747374736574;
  *(undefined4 *)((long)puStack_288 + 9) = 0x676e69;
  pcVar11 = "teststring";
  pcStack_298 = (code *)0x103a29;
  (*pbVar10->set_key)((btree *)0x0,&puStack_290,&puStack_288);
  __ptr = puStack_290;
  pcStack_298 = (code *)0x103a38;
  iVar6 = strcmp((char *)(puStack_290 + 1),"teststring");
  if (iVar6 == 0) {
    pcStack_298 = (code *)0x103a48;
    free(__ptr);
    pcStack_298 = (code *)0x103a52;
    puStack_290 = (undefined2 *)malloc(0x15);
    *puStack_290 = 0x1300;
    pcVar11 = (char *)(puStack_290 + 1);
    pcVar11[0] = 'u';
    pcVar11[1] = 'p';
    pcVar11[2] = 'd';
    pcVar11[3] = 'a';
    pcVar11[4] = 't';
    pcVar11[5] = 'e';
    pcVar11[6] = 'd';
    pcVar11[7] = ' ';
    pcVar11 = (char *)(puStack_290 + 5);
    pcVar11[0] = 't';
    pcVar11[1] = 'e';
    pcVar11[2] = 's';
    pcVar11[3] = 't';
    pcVar11[4] = 's';
    pcVar11[5] = 't';
    pcVar11[6] = 'r';
    pcVar11[7] = 'i';
    *(undefined4 *)((long)puStack_290 + 0x11) = 0x676e69;
    pcVar11 = "updated teststring";
    pcStack_298 = (code *)0x103a83;
    (*pbVar10->set_key)((btree *)0x0,&puStack_288,&puStack_290);
    __ptr = puStack_288;
    pcStack_298 = (code *)0x103a92;
    iVar6 = strcmp((char *)(puStack_288 + 1),"updated teststring");
    if (iVar6 == 0) {
      pcStack_298 = (code *)0x103a9e;
      free(pbVar10);
      pcStack_298 = (code *)0x103aa6;
      free(__ptr);
      pcStack_298 = (code *)0x103aaf;
      free(puStack_290);
      pcStack_298 = (code *)0x103ab4;
      memleak_end();
      pcVar11 = "%s PASSED\n";
      if (kv_set_str_key_test()::__test_pass != '\0') {
        pcVar11 = "%s FAILED\n";
      }
      pcStack_298 = (code *)0x103ae5;
      fprintf(_stderr,pcVar11,"kv_set_str_key_test");
      return;
    }
  }
  else {
    pcStack_298 = (code *)0x103af4;
    kv_set_str_key_test();
  }
  pcStack_298 = kv_set_str_value_test;
  kv_set_str_key_test();
  pbStack_2b0 = pbVar10;
  puStack_2a8 = puVar15;
  puStack_2a0 = __ptr;
  pcStack_298 = (code *)pcVar11;
  gettimeofday(&tStack_2f8,(__timezone_ptr_t)0x0);
  memleak_start();
  lStack_308 = 100;
  bStack_2e8.vsize = '\b';
  pbVar10 = btree_str_kv_get_kb64_vb64((btree_kv_ops *)0x0);
  (*pbVar10->set_value)(&bStack_2e8,&lStack_308,&lStack_300);
  if (lStack_308 != lStack_300) {
    kv_set_str_value_test();
  }
  lStack_300 = 200;
  (*pbVar10->set_value)(&bStack_2e8,&lStack_300,&lStack_308);
  if (lStack_308 != lStack_300) {
    kv_set_str_value_test();
  }
  free(pbVar10);
  memleak_end();
  pcVar11 = "%s PASSED\n";
  if (kv_set_str_value_test()::__test_pass != '\0') {
    pcVar11 = "%s FAILED\n";
  }
  fprintf(_stderr,pcVar11,"kv_set_str_value_test");
  return;
}

Assistant:

void kv_get_var_nentry_test()
{
    TEST_INIT();
    memleak_start();

    bnoderef node;
    btree_kv_ops *kv_ops;
    uint8_t ksize, vsize;
    uint8_t v, v_out;
    idx_t idx;
    int cmp, i;
    void *k_out = NULL;

    const char *keys[] = {"string",
                          "longstring",
                          "longerstring",
                          "",
                          "123231234242423428492342",
                          "string with space"};

    int n =  sizeof(keys)/sizeof(void *);
    void **key_ptrs = alca(void *, n);

    for (i = 0; i < n; i++) {
        construct_key_ptr(keys[i], strlen(keys[i]) + 1, &key_ptrs[i]);
    }

    ksize = strlen(keys[0]) + 1 + sizeof(key_len_t);
    vsize = sizeof(v);
    node = dummy_node(ksize, vsize, 1);
    node->nentry = n;

    v = 100;
    kv_ops = alca(btree_kv_ops, 1);
    btree_str_kv_get_kb64_vb64(kv_ops);

    // set n keys
    for (idx = 0; idx < n; idx ++){
        kv_ops->set_kv(node, idx, &key_ptrs[idx], (void *)&v);
        v++;
    }

    // get n keys
    v = 100;
    for (idx = 0; idx < n; idx ++){
        kv_ops->get_kv(node, idx, &k_out, (void *)&v_out);
        char *node_str = (char *)((uint8_t *)k_out + sizeof(key_len_t));
        cmp = strcmp(node_str, keys[idx]);
        TEST_CHK(cmp == 0);
        cmp = memcmp(&v_out, &v, vsize);
        TEST_CHK(cmp == 0);
        v++;
    }


    void *vars[] = {(void *)node, k_out};
    freevars(vars, sizeof(vars)/sizeof(void *));
    freevars(key_ptrs, n);
    memleak_end();
    TEST_RESULT("kv_get_var_nentry_test");
}